

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_cache_client.cpp
# Opt level: O0

void __thiscall cppcms::impl::tcp_cache::rise(tcp_cache *this,string *trigger)

{
  undefined4 uVar1;
  string *in_RSI;
  tcp_operation_header *in_RDI;
  tcp_connector *unaff_retaddr;
  string data;
  tcp_operation_header h;
  string local_58 [32];
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  
  local_28 = 0;
  uStack_20 = 0;
  uStack_30 = 0;
  local_18 = 0;
  local_38 = 1;
  uVar1 = std::__cxx11::string::size();
  local_38 = CONCAT44(uVar1,(undefined4)local_38);
  std::__cxx11::string::string(local_58,(string *)in_RSI);
  uVar1 = std::__cxx11::string::size();
  local_28 = CONCAT44(local_28._4_4_,uVar1);
  tcp_connector::broadcast(unaff_retaddr,in_RDI,in_RSI);
  std::__cxx11::string::~string(local_58);
  return;
}

Assistant:

void tcp_cache::rise(std::string const &trigger)
{
	tcp_operation_header h=tcp_operation_header();
	h.opcode=opcodes::rise;
	h.size=trigger.size();
	std::string data=trigger;
	h.operations.rise.trigger_len=trigger.size();
	broadcast(h,data);
}